

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void obj_list(t_object *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _inlet *local_40;
  _inlet *ip;
  t_atom *ptStack_30;
  int count;
  t_atom *ap;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_object *x_local;
  
  local_40 = x->te_inlet;
  if (argc == 0) {
    pd_emptylist((t_pd *)x);
  }
  else {
    ip._4_4_ = argc + -1;
    ptStack_30 = argv + 1;
    while( true ) {
      iVar1 = ip._4_4_;
      if (local_40 != (_inlet *)0x0) {
        ip._4_4_ = ip._4_4_ + -1;
      }
      if (local_40 == (_inlet *)0x0 || iVar1 == 0) break;
      if (ptStack_30->a_type == A_POINTER) {
        pd_pointer(&local_40->i_pd,(ptStack_30->a_w).w_gpointer);
      }
      else if (ptStack_30->a_type == A_FLOAT) {
        pd_float(&local_40->i_pd,(ptStack_30->a_w).w_float);
      }
      else {
        pd_symbol(&local_40->i_pd,(ptStack_30->a_w).w_symbol);
      }
      ptStack_30 = ptStack_30 + 1;
      local_40 = local_40->i_next;
    }
    if (argv->a_type == A_POINTER) {
      pd_pointer((t_pd *)x,(argv->a_w).w_gpointer);
    }
    else if (argv->a_type == A_FLOAT) {
      pd_float((t_pd *)x,(argv->a_w).w_float);
    }
    else {
      pd_symbol((t_pd *)x,(argv->a_w).w_symbol);
    }
  }
  return;
}

Assistant:

void obj_list(t_object *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom *ap;
    int count;
    t_inlet *ip = ((t_object *)x)->ob_inlet;
    if (!argc)
    {
        pd_emptylist(&x->ob_pd);
        return;
    }
    for (count = argc-1, ap = argv+1; ip && count--; ap++, ip = ip->i_next)
    {
        if (ap->a_type == A_POINTER) pd_pointer(&ip->i_pd, ap->a_w.w_gpointer);
        else if (ap->a_type == A_FLOAT) pd_float(&ip->i_pd, ap->a_w.w_float);
        else pd_symbol(&ip->i_pd, ap->a_w.w_symbol);
    }
    if (argv->a_type == A_POINTER) pd_pointer(&x->ob_pd, argv->a_w.w_gpointer);
    else if (argv->a_type == A_FLOAT) pd_float(&x->ob_pd, argv->a_w.w_float);
    else pd_symbol(&x->ob_pd, argv->a_w.w_symbol);
}